

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O0

SockAddr * AGSSock::SockAddr_CreateIP(char *ip,ags_t port)

{
  SockAddr *sa;
  SockAddr *addr;
  ags_t port_local;
  char *ip_local;
  
  sa = SockAddr_Create(2);
  SockAddr_set_IP(sa,ip);
  SockAddr_set_Port(sa,port);
  return sa;
}

Assistant:

SockAddr *SockAddr_CreateIP(const char *ip, ags_t port)
{
	SockAddr *addr = SockAddr_Create(AF_INET);
	SockAddr_set_IP(addr, ip);
	SockAddr_set_Port(addr, port);
	return addr;
}